

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::MergeFrom
          (CategoricalMapping *this,CategoricalMapping *from)

{
  void *pvVar1;
  ValueOnUnknownUnion VVar2;
  LogMessage *other;
  Int64ToStringMap *this_00;
  StringToInt64Map *this_01;
  Int64ToStringMap *from_00;
  StringToInt64Map *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/CategoricalMapping.pb.cc"
               ,0x18a);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] != 1) {
    if (from->_oneof_case_[0] != 2) goto LAB_002a061b;
    if (this->_oneof_case_[0] == 2) {
      this_00 = (this->MappingType_).int64tostringmap_;
LAB_002a05be:
      from_00 = (from->MappingType_).int64tostringmap_;
    }
    else {
      clear_MappingType(this);
      this->_oneof_case_[0] = 2;
      this_00 = (Int64ToStringMap *)operator_new(0x38);
      Int64ToStringMap::Int64ToStringMap(this_00);
      (this->MappingType_).int64tostringmap_ = this_00;
      if (from->_oneof_case_[0] == 2) goto LAB_002a05be;
      from_00 = Int64ToStringMap::default_instance();
    }
    Int64ToStringMap::MergeFrom(this_00,from_00);
    goto LAB_002a061b;
  }
  if (this->_oneof_case_[0] == 1) {
    this_01 = (this->MappingType_).stringtoint64map_;
LAB_002a05f3:
    from_01 = (from->MappingType_).stringtoint64map_;
  }
  else {
    clear_MappingType(this);
    this->_oneof_case_[0] = 1;
    this_01 = (StringToInt64Map *)operator_new(0x38);
    StringToInt64Map::StringToInt64Map(this_01);
    (this->MappingType_).stringtoint64map_ = this_01;
    if (from->_oneof_case_[0] == 1) goto LAB_002a05f3;
    from_01 = StringToInt64Map::default_instance();
  }
  StringToInt64Map::MergeFrom(this_01,from_01);
LAB_002a061b:
  if (from->_oneof_case_[1] == 0x66) {
    VVar2 = from->ValueOnUnknown_;
    if (this->_oneof_case_[1] != 0x66) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x66;
    }
    this->ValueOnUnknown_ = VVar2;
  }
  else if (from->_oneof_case_[1] == 0x65) {
    VVar2 = from->ValueOnUnknown_;
    if (this->_oneof_case_[1] == 0x65) {
      if ((string *)(this->ValueOnUnknown_).int64value_ !=
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        std::__cxx11::string::_M_assign((string *)(this->ValueOnUnknown_).int64value_);
        return;
      }
    }
    else {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x65;
      (this->ValueOnUnknown_).int64value_ =
           (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->ValueOnUnknown_).strvalue_,(string *)VVar2);
  }
  return;
}

Assistant:

void CategoricalMapping::MergeFrom(const CategoricalMapping& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalMapping)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.MappingType_case()) {
    case kStringToInt64Map: {
      mutable_stringtoint64map()->::CoreML::Specification::StringToInt64Map::MergeFrom(from.stringtoint64map());
      break;
    }
    case kInt64ToStringMap: {
      mutable_int64tostringmap()->::CoreML::Specification::Int64ToStringMap::MergeFrom(from.int64tostringmap());
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (from.ValueOnUnknown_case()) {
    case kStrValue: {
      set_strvalue(from.strvalue());
      break;
    }
    case kInt64Value: {
      set_int64value(from.int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
}